

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_discard_undo(nk_text_undo_state *state)

{
  short sVar1;
  void *in_RDI;
  int i;
  int n;
  int local_10;
  
  if (0 < *(short *)((long)in_RDI + 0x1440)) {
    if (-1 < *(short *)((long)in_RDI + 8)) {
      sVar1 = *(short *)((long)in_RDI + 4);
      *(short *)((long)in_RDI + 0x1444) = *(short *)((long)in_RDI + 0x1444) - sVar1;
      nk_memcopy((void *)((long)in_RDI + 0x4a4),
                 (void *)((long)in_RDI + (long)(int)sVar1 * 4 + 0x4a4),
                 (long)*(short *)((long)in_RDI + 0x1444) << 2);
      for (local_10 = 0; local_10 < *(short *)((long)in_RDI + 0x1440); local_10 = local_10 + 1) {
        if (-1 < *(short *)((long)in_RDI + (long)local_10 * 0xc + 8)) {
          *(short *)((long)in_RDI + (long)local_10 * 0xc + 8) =
               *(short *)((long)in_RDI + (long)local_10 * 0xc + 8) - sVar1;
        }
      }
    }
    *(short *)((long)in_RDI + 0x1440) = *(short *)((long)in_RDI + 0x1440) + -1;
    nk_memcopy(in_RDI,(void *)((long)in_RDI + 0xc),(long)*(short *)((long)in_RDI + 0x1440) * 0xc);
  }
  return;
}

Assistant:

NK_INTERN void
nk_textedit_discard_undo(struct nk_text_undo_state *state)
{
/* discard the oldest entry in the undo list */
if (state->undo_point > 0) {
/* if the 0th undo state has characters, clean those up */
if (state->undo_rec[0].char_storage >= 0) {
int n = state->undo_rec[0].insert_length, i;
/* delete n characters from all other records */
state->undo_char_point = (short)(state->undo_char_point - n);
NK_MEMCPY(state->undo_char, state->undo_char + n,
(nk_size)state->undo_char_point*sizeof(nk_rune));
for (i=0; i < state->undo_point; ++i) {
if (state->undo_rec[i].char_storage >= 0)
state->undo_rec[i].char_storage = (short)
(state->undo_rec[i].char_storage - n);
}
}
--state->undo_point;
NK_MEMCPY(state->undo_rec, state->undo_rec+1,
(nk_size)((nk_size)state->undo_point * sizeof(state->undo_rec[0])));
}
}